

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void tcg_out_sib_offset(TCGContext_conflict9 *s,int r,int rm,int index,int shift,intptr_t offset)

{
  long lVar1;
  uint32_t v;
  uint32_t v_00;
  intptr_t disp;
  intptr_t pc;
  int len;
  int mod;
  intptr_t offset_local;
  int shift_local;
  int index_local;
  int rm_local;
  int r_local;
  TCGContext_conflict9 *s_local;
  
  v = (uint32_t)offset;
  if ((index < 0) && (rm < 0)) {
    lVar1 = offset - (long)(s->code_ptr + (long)(int)(rm ^ 0xffffffff) + 5);
    v_00 = (uint32_t)lVar1;
    if (lVar1 == (int)v_00) {
      tcg_out8(s,(byte)((r & 7U) << 3) | 5);
      tcg_out32(s,v_00);
    }
    else {
      if (offset != (int)v) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
                   ,0x2dc,(char *)0x0);
      }
      tcg_out8(s,(byte)((r & 7U) << 3) | 4);
      tcg_out8(s,'%');
      tcg_out32(s,v);
    }
  }
  else {
    if (rm < 0) {
      pc._4_1_ = 0;
      pc._0_4_ = 4;
      shift_local = 5;
    }
    else {
      shift_local = rm;
      if ((offset == 0) && ((rm & 7U) != 5)) {
        pc._4_1_ = 0;
        pc._0_4_ = 0;
      }
      else if (offset == (char)(uint8_t)offset) {
        pc._4_1_ = 0x40;
        pc._0_4_ = 1;
      }
      else {
        pc._4_1_ = 0x80;
        pc._0_4_ = 4;
      }
    }
    if ((index < 0) && ((shift_local & 7U) != 4)) {
      tcg_out8(s,pc._4_1_ | (byte)((r & 7U) << 3) | (byte)shift_local & 7);
    }
    else {
      offset_local._4_4_ = index;
      if (index < 0) {
        offset_local._4_4_ = 4;
      }
      tcg_out8(s,pc._4_1_ | (byte)((r & 7U) << 3) | 4);
      tcg_out8(s,(byte)(shift << 6) | (byte)((offset_local._4_4_ & 7) << 3) | (byte)shift_local & 7)
      ;
    }
    if ((int)pc == 1) {
      tcg_out8(s,(uint8_t)offset);
    }
    else if ((int)pc == 4) {
      tcg_out32(s,v);
    }
  }
  return;
}

Assistant:

static void tcg_out_sib_offset(TCGContext *s, int r, int rm, int index,
                               int shift, intptr_t offset)
{
    int mod, len;

    if (index < 0 && rm < 0) {
        if (TCG_TARGET_REG_BITS == 64) {
            /* Try for a rip-relative addressing mode.  This has replaced
               the 32-bit-mode absolute addressing encoding.  */
            intptr_t pc = (intptr_t)s->code_ptr + 5 + ~rm;
            intptr_t disp = offset - pc;
            if (disp == (int32_t)disp) {
                tcg_out8(s, (LOWREGMASK(r) << 3) | 5);
                tcg_out32(s, disp);
                return;
            }

            /* Try for an absolute address encoding.  This requires the
               use of the MODRM+SIB encoding and is therefore larger than
               rip-relative addressing.  */
            if (offset == (int32_t)offset) {
                tcg_out8(s, (LOWREGMASK(r) << 3) | 4);
                tcg_out8(s, (4 << 3) | 5);
                tcg_out32(s, offset);
                return;
            }

            /* ??? The memory isn't directly addressable.  */
            g_assert_not_reached();
        } else {
            /* Absolute address.  */
            tcg_out8(s, (r << 3) | 5);
            tcg_out32(s, offset);
            return;
        }
    }

    /* Find the length of the immediate addend.  Note that the encoding
       that would be used for (%ebp) indicates absolute addressing.  */
    if (rm < 0) {
        mod = 0, len = 4, rm = 5;
    } else if (offset == 0 && LOWREGMASK(rm) != TCG_REG_EBP) {
        mod = 0, len = 0;
    } else if (offset == (int8_t)offset) {
        mod = 0x40, len = 1;
    } else {
        mod = 0x80, len = 4;
    }

    /* Use a single byte MODRM format if possible.  Note that the encoding
       that would be used for %esp is the escape to the two byte form.  */
    if (index < 0 && LOWREGMASK(rm) != TCG_REG_ESP) {
        /* Single byte MODRM format.  */
        tcg_out8(s, mod | (LOWREGMASK(r) << 3) | LOWREGMASK(rm));
    } else {
        /* Two byte MODRM+SIB format.  */

        /* Note that the encoding that would place %esp into the index
           field indicates no index register.  In 64-bit mode, the REX.X
           bit counts, so %r12 can be used as the index.  */
        if (index < 0) {
            index = 4;
        } else {
            tcg_debug_assert(index != TCG_REG_ESP);
        }

        tcg_out8(s, mod | (LOWREGMASK(r) << 3) | 4);
        tcg_out8(s, (shift << 6) | (LOWREGMASK(index) << 3) | LOWREGMASK(rm));
    }

    if (len == 1) {
        tcg_out8(s, offset);
    } else if (len == 4) {
        tcg_out32(s, offset);
    }
}